

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::ClientImpl::write_content_with_provider
          (ClientImpl *this,Stream *strm,Request *req,Error *error)

{
  bool bVar1;
  anon_class_1_0_00000001 is_shutting_down;
  anon_class_1_0_00000001 local_29;
  compressor *local_28;
  
  if (req->is_chunked_content_provider_ == true) {
    detail::make_unique<httplib::detail::nocompressor>();
    bVar1 = detail::
            write_content_chunked<httplib::ClientImpl::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Error&)::_lambda()_1_,httplib::detail::compressor>
                      (strm,&req->content_provider_,&local_29,local_28,error);
    (*local_28->_vptr_compressor[1])(local_28);
    return bVar1;
  }
  bVar1 = detail::
          write_content<httplib::ClientImpl::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Error&)::_lambda()_1_>
                    (strm,&req->content_provider_,0,req->content_length_,error);
  return bVar1;
}

Assistant:

inline bool ClientImpl::write_content_with_provider(Stream &strm,
														const Request &req,
														Error &error) {
		auto is_shutting_down = []() { return false; };

		if (req.is_chunked_content_provider_) {
			// TODO: Brotli suport
			std::unique_ptr<detail::compressor> compressor;
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
			if (compress_) {
      compressor = detail::make_unique<detail::gzip_compressor>();
    } else
#endif
			{
				compressor = detail::make_unique<detail::nocompressor>();
			}

			return detail::write_content_chunked(strm, req.content_provider_,
												 is_shutting_down, *compressor, error);
		} else {
			return detail::write_content(strm, req.content_provider_, 0,
										 req.content_length_, is_shutting_down, error);
		}
	}